

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O0

void anon_unknown.dwarf_178f1b::readFirstPart(string *fn)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int type;
  int width;
  undefined4 uVar5;
  undefined4 uVar6;
  int type_00;
  int iVar7;
  int iVar8;
  int iVar9;
  ostream *this;
  reference pvVar10;
  char *pcVar11;
  uint *puVar12;
  Box2i b2_1;
  Box2i b1_1;
  DeepFrameBuffer frameBuffer_3;
  int numYTiles_1;
  int numXTiles_1;
  int h_1;
  int w_1;
  int ly_1;
  int lx_1;
  int ty2_1;
  int ty1_1;
  int tx2_1;
  int tx1_1;
  int numYLevels_1;
  int numXLevels_1;
  DeepTiledInputFile part_3;
  int l2_1;
  int l1_1;
  DeepFrameBuffer frameBuffer_2;
  DeepScanLineInputFile part_2;
  Box2i b2;
  Box2i b1;
  FrameBuffer frameBuffer_1;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int numYLevels;
  int numXLevels;
  int ly;
  int lx;
  int ty2;
  int ty1;
  int tx2;
  int tx1;
  TiledInputFile part_1;
  FrameBuffer frameBuffer;
  int l2;
  int l1;
  InputFile part;
  int levelMode;
  int partType;
  int pixelType;
  Array2D<unsigned_int> sampleCount;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  int in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  int in_stack_fffffffffffffb48;
  int y2;
  int in_stack_fffffffffffffb4c;
  int in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  undefined1 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb59;
  undefined1 in_stack_fffffffffffffb5a;
  undefined1 in_stack_fffffffffffffb5b;
  int in_stack_fffffffffffffb5c;
  int in_stack_fffffffffffffb60;
  undefined4 uVar13;
  int in_stack_fffffffffffffb64;
  PixelType PVar14;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffc1c;
  undefined1 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc21;
  undefined1 in_stack_fffffffffffffc22;
  undefined1 in_stack_fffffffffffffc23;
  undefined4 in_stack_fffffffffffffc24;
  Array2D<float_*> *in_stack_fffffffffffffc28;
  Array2D<float> *fData_00;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined8 in_stack_fffffffffffffc38;
  int iVar15;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  value_type vVar16;
  undefined1 local_3a0 [12];
  int local_394;
  undefined1 local_390 [16];
  Slice local_380 [56];
  Slice local_348 [104];
  undefined4 local_2e0;
  undefined4 local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  undefined4 local_2b4;
  undefined1 local_2b0 [96];
  Slice local_250 [104];
  DeepFrameBuffer local_1e8;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined1 local_148 [80];
  int local_f8;
  int local_f4;
  FrameBuffer local_f0;
  Array2D<unsigned_int> local_c0;
  Array2D<Imath_3_2::half_*> local_a8;
  Array2D<float_*> local_90;
  Array2D<unsigned_int_*> local_78;
  Array2D<Imath_3_2::half> local_60;
  Array2D<float> local_38;
  Array2D<unsigned_int> local_20;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  Imf_3_4::Array2D<unsigned_int>::Array2D(&local_20);
  Imf_3_4::Array2D<float>::Array2D(&local_38);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&local_60);
  Imf_3_4::Array2D<unsigned_int_*>::Array2D(&local_78);
  Imf_3_4::Array2D<float_*>::Array2D(&local_90);
  Imf_3_4::Array2D<Imath_3_2::half_*>::Array2D(&local_a8);
  Imf_3_4::Array2D<unsigned_int>::Array2D(&local_c0);
  this = std::operator<<((ostream *)&std::cout,"Reading first part ");
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,0);
  local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *pvVar10;
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,0);
  local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = *pvVar10;
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::levelModes,0);
  local_f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = *pvVar10;
  switch((value_type)local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
  case 0:
    vVar16 = (value_type)local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar2 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)&local_f0,pcVar11,iVar2);
    iVar15 = (int)((ulong)pcVar11 >> 0x20);
    iVar3 = random_int(in_stack_fffffffffffffb44);
    local_f4 = iVar3;
    iVar4 = random_int(in_stack_fffffffffffffb44);
    local_f8 = iVar4;
    if (iVar4 < local_f4) {
      std::swap<int>(&local_f4,&local_f8);
    }
    fData_00 = (Array2D<float> *)(local_148 + 0x20);
    Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1be65c);
    setInputFrameBuffer((FrameBuffer *)CONCAT44(iVar2,in_stack_fffffffffffffc40),iVar15,
                        (Array2D<unsigned_int> *)CONCAT44(iVar3,iVar4),fData_00,
                        (Array2D<Imath_3_2::half> *)
                        CONCAT44(in_stack_fffffffffffffc24,
                                 CONCAT13(in_stack_fffffffffffffc23,
                                          CONCAT12(in_stack_fffffffffffffc22,
                                                   CONCAT11(in_stack_fffffffffffffc21,
                                                            in_stack_fffffffffffffc20)))),
                        in_stack_fffffffffffffc1c,vVar16);
    Imf_3_4::InputFile::setFrameBuffer(&local_f0);
    Imf_3_4::InputFile::readPixels((int)&local_f0,local_f4);
    if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffb5c,
                                  CONCAT13(in_stack_fffffffffffffb5b,
                                           CONCAT12(in_stack_fffffffffffffb5a,
                                                    CONCAT11(in_stack_fffffffffffffb59,
                                                             in_stack_fffffffffffffb58)))),
                         in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                         in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48,
                         in_stack_fffffffffffffb44);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x450,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 1) {
      bVar1 = checkPixels<float>((Array2D<float> *)
                                 CONCAT44(in_stack_fffffffffffffb5c,
                                          CONCAT13(in_stack_fffffffffffffb5b,
                                                   CONCAT12(in_stack_fffffffffffffb5a,
                                                            CONCAT11(in_stack_fffffffffffffb59,
                                                                     in_stack_fffffffffffffb58)))),
                                 in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                                 in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48,
                                 in_stack_fffffffffffffb44);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x454,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>
                               ((Array2D<Imath_3_2::half> *)
                                CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                in_stack_fffffffffffffb64,in_stack_fffffffffffffb60,
                                in_stack_fffffffffffffb5c,
                                CONCAT13(in_stack_fffffffffffffb5b,
                                         CONCAT12(in_stack_fffffffffffffb5a,
                                                  CONCAT11(in_stack_fffffffffffffb59,
                                                           in_stack_fffffffffffffb58))),
                                in_stack_fffffffffffffb54), !bVar1)) {
      __assert_fail("checkPixels<half> (hData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x458,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1be864);
    Imf_3_4::InputFile::~InputFile
              ((InputFile *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    break;
  case 1:
    vVar16 = (value_type)local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)local_148,pcVar11,iVar3);
    local_164 = Imf_3_4::TiledInputFile::numXLevels();
    local_168 = Imf_3_4::TiledInputFile::numYLevels();
    local_15c = random_int(in_stack_fffffffffffffb44);
    local_160 = random_int(in_stack_fffffffffffffb44);
    if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ == 1) {
      local_160 = local_15c;
    }
    local_16c = Imf_3_4::TiledInputFile::levelWidth((int)local_148);
    local_170 = Imf_3_4::TiledInputFile::levelHeight((int)local_148);
    local_174 = Imf_3_4::TiledInputFile::numXTiles((int)local_148);
    local_178 = Imf_3_4::TiledInputFile::numYTiles((int)local_148);
    local_14c = random_int(in_stack_fffffffffffffb44);
    local_150 = random_int(in_stack_fffffffffffffb44);
    local_154 = random_int(in_stack_fffffffffffffb44);
    local_158 = random_int(in_stack_fffffffffffffb44);
    if (local_150 < local_14c) {
      std::swap<int>(&local_14c,&local_150);
    }
    if (local_158 < local_154) {
      std::swap<int>(&local_154,&local_158);
    }
    Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1beb21);
    setInputFrameBuffer((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40)
                        ,iVar2,(Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                        (Array2D<float> *)in_stack_fffffffffffffc28,
                        (Array2D<Imath_3_2::half> *)
                        CONCAT44(in_stack_fffffffffffffc24,
                                 CONCAT13(in_stack_fffffffffffffc23,
                                          CONCAT12(in_stack_fffffffffffffc22,
                                                   CONCAT11(in_stack_fffffffffffffc21,
                                                            in_stack_fffffffffffffc20)))),iVar3,
                        vVar16);
    Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)local_148);
    Imf_3_4::TiledInputFile::readTiles
              ((int)local_148,local_14c,local_150,local_154,local_158,local_15c);
    Imf_3_4::TiledInputFile::dataWindowForTile
              ((int)&local_1e8 + 0x30,(int)local_148,local_14c,local_154);
    Imf_3_4::TiledInputFile::dataWindowForTile
              ((int)&local_1e8 + 0x20,(int)local_148,local_150,local_158);
    if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffb5c,
                                  CONCAT13(in_stack_fffffffffffffb5b,
                                           CONCAT12(in_stack_fffffffffffffb5a,
                                                    CONCAT11(in_stack_fffffffffffffb59,
                                                             in_stack_fffffffffffffb58)))),
                         in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                         in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48,
                         in_stack_fffffffffffffb44);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x485,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 1) {
      bVar1 = checkPixels<float>((Array2D<float> *)
                                 CONCAT44(in_stack_fffffffffffffb5c,
                                          CONCAT13(in_stack_fffffffffffffb5b,
                                                   CONCAT12(in_stack_fffffffffffffb5a,
                                                            CONCAT11(in_stack_fffffffffffffb59,
                                                                     in_stack_fffffffffffffb58)))),
                                 in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                                 in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48,
                                 in_stack_fffffffffffffb44);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x489,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>
                               ((Array2D<Imath_3_2::half> *)
                                CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                in_stack_fffffffffffffb64,in_stack_fffffffffffffb60,
                                in_stack_fffffffffffffb5c,
                                CONCAT13(in_stack_fffffffffffffb5b,
                                         CONCAT12(in_stack_fffffffffffffb5a,
                                                  CONCAT11(in_stack_fffffffffffffb59,
                                                           in_stack_fffffffffffffb58))),
                                in_stack_fffffffffffffb54), !bVar1)) {
      __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x48d,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1bedd6);
    Imf_3_4::TiledInputFile::~TiledInputFile
              ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    break;
  case 2:
    vVar16 = (value_type)local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&local_1e8,pcVar11,iVar3);
    Imf_3_4::DeepFrameBuffer::DeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    Imf_3_4::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               CONCAT44(in_stack_fffffffffffffb5c,
                        CONCAT13(in_stack_fffffffffffffb5b,
                                 CONCAT12(in_stack_fffffffffffffb5a,
                                          CONCAT11(in_stack_fffffffffffffb59,
                                                   in_stack_fffffffffffffb58)))),
               CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    puVar12 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_c0,0);
    iVar3 = 0;
    Imf_3_4::Slice::Slice
              ((Slice *)(local_2b0 + 0x28),UINT,(char *)puVar12,4,0x304,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_250);
    setInputDeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               iVar2,(Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,
               (Array2D<Imath_3_2::half_*> *)
               CONCAT44(in_stack_fffffffffffffc24,
                        CONCAT13(in_stack_fffffffffffffc23,
                                 CONCAT12(in_stack_fffffffffffffc22,
                                          CONCAT11(in_stack_fffffffffffffc21,
                                                   in_stack_fffffffffffffc20)))),
               in_stack_fffffffffffffc1c,vVar16);
    Imf_3_4::DeepScanLineInputFile::setFrameBuffer(&local_1e8);
    local_2b0._36_4_ = random_int(in_stack_fffffffffffffb44);
    local_2b0._32_4_ = random_int(in_stack_fffffffffffffb44);
    if ((int)local_2b0._32_4_ < (int)local_2b0._36_4_) {
      std::swap<int>((int *)(local_2b0 + 0x24),(int *)(local_2b0 + 0x20));
    }
    Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts((int)&local_1e8,local_2b0._36_4_);
    bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffffb5c,
                                      CONCAT13(in_stack_fffffffffffffb5b,
                                               CONCAT12(in_stack_fffffffffffffb5a,
                                                        CONCAT11(in_stack_fffffffffffffb59,
                                                                 in_stack_fffffffffffffb58)))),
                             in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                             in_stack_fffffffffffffb4c,iVar3,in_stack_fffffffffffffb44);
    if (!bVar1) {
      __assert_fail("checkSampleCount (sampleCount, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x4b1,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(in_stack_fffffffffffffb84,
                   (Array2D<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (Array2D<unsigned_int_*> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
                   ,(Array2D<Imath_3_2::half_*> *)
                    CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   in_stack_fffffffffffffb5c,in_stack_fffffffffffffb90,in_stack_fffffffffffffb98,
                   in_stack_fffffffffffffba0);
    Imf_3_4::DeepScanLineInputFile::readPixels((int)&local_1e8,local_2b0._36_4_);
    if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                         (Array2D<unsigned_int_*> *)
                         CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c,
                         CONCAT13(in_stack_fffffffffffffb5b,
                                  CONCAT12(in_stack_fffffffffffffb5a,
                                           CONCAT11(in_stack_fffffffffffffb59,
                                                    in_stack_fffffffffffffb58))),
                         in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                         in_stack_fffffffffffffb80);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4c4,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 1) {
      bVar1 = checkPixels<float>((Array2D<unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                 (Array2D<float_*> *)
                                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                 in_stack_fffffffffffffb5c,
                                 CONCAT13(in_stack_fffffffffffffb5b,
                                          CONCAT12(in_stack_fffffffffffffb5a,
                                                   CONCAT11(in_stack_fffffffffffffb59,
                                                            in_stack_fffffffffffffb58))),
                                 in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                                 in_stack_fffffffffffffb80);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4c8,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>
                               ((Array2D<unsigned_int> *)
                                CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                (Array2D<Imath_3_2::half_*> *)
                                CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                in_stack_fffffffffffffb5c,
                                CONCAT13(in_stack_fffffffffffffb5b,
                                         CONCAT12(in_stack_fffffffffffffb5a,
                                                  CONCAT11(in_stack_fffffffffffffb59,
                                                           in_stack_fffffffffffffb58))),
                                in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                                in_stack_fffffffffffffb80), !bVar1)) {
      __assert_fail("checkPixels<half> ( sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x4cc,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    in_stack_fffffffffffffb40 = local_2b0._32_4_;
    releasePixels(in_stack_fffffffffffffb74,
                  (Array2D<unsigned_int_*> *)
                  CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                  (Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                  (Array2D<Imath_3_2::half_*> *)
                  CONCAT44(in_stack_fffffffffffffb5c,
                           CONCAT13(in_stack_fffffffffffffb5b,
                                    CONCAT12(in_stack_fffffffffffffb5a,
                                             CONCAT11(in_stack_fffffffffffffb59,
                                                      in_stack_fffffffffffffb58)))),
                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,in_stack_fffffffffffffb80,
                  in_stack_fffffffffffffb88);
    Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1bf268);
    Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile
              ((DeepScanLineInputFile *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    break;
  case 3:
    vVar16 = (value_type)local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)local_2b0,pcVar11,iVar3);
    iVar15 = (int)pcVar11;
    local_2b4 = Imf_3_4::DeepTiledInputFile::numXLevels();
    iVar3 = Imf_3_4::DeepTiledInputFile::numYLevels();
    local_2b8 = iVar3;
    local_2cc = random_int(in_stack_fffffffffffffb44);
    iVar4 = random_int(in_stack_fffffffffffffb44);
    local_2d0 = iVar4;
    if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ == 1) {
      local_2d0 = local_2cc;
    }
    type = Imf_3_4::DeepTiledInputFile::levelWidth((int)local_2b0);
    local_2d4 = type;
    width = Imf_3_4::DeepTiledInputFile::levelHeight((int)local_2b0);
    local_2d8 = width;
    uVar5 = Imf_3_4::DeepTiledInputFile::numXTiles((int)local_2b0);
    local_2dc = uVar5;
    uVar6 = Imf_3_4::DeepTiledInputFile::numYTiles((int)local_2b0);
    local_2e0 = uVar6;
    type_00 = random_int(in_stack_fffffffffffffb44);
    local_2bc = type_00;
    iVar7 = random_int(in_stack_fffffffffffffb44);
    local_2c0 = iVar7;
    iVar8 = random_int(in_stack_fffffffffffffb44);
    local_2c4 = iVar8;
    iVar9 = random_int(in_stack_fffffffffffffb44);
    local_2c8 = iVar9;
    if (local_2c0 < local_2bc) {
      std::swap<int>(&local_2bc,&local_2c0);
    }
    if (local_2c8 < local_2c4) {
      std::swap<int>(&local_2c4,&local_2c8);
    }
    Imf_3_4::DeepFrameBuffer::DeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    Imf_3_4::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               CONCAT44(in_stack_fffffffffffffb5c,
                        CONCAT13(in_stack_fffffffffffffb5b,
                                 CONCAT12(in_stack_fffffffffffffb5a,
                                          CONCAT11(in_stack_fffffffffffffb59,
                                                   in_stack_fffffffffffffb58)))),
               CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    PVar14 = UINT;
    puVar12 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_c0,0);
    y2 = 0;
    Imf_3_4::Slice::Slice
              (local_380,PVar14,(char *)puVar12,4,(long)local_2d4 << 2,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_348);
    setInputDeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               iVar2,(Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,
               (Array2D<Imath_3_2::half_*> *)
               CONCAT44(in_stack_fffffffffffffc24,
                        CONCAT13(in_stack_fffffffffffffc23,
                                 CONCAT12(in_stack_fffffffffffffc22,
                                          CONCAT11(in_stack_fffffffffffffc21,
                                                   in_stack_fffffffffffffc20)))),
               in_stack_fffffffffffffc1c,vVar16);
    Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)local_2b0);
    Imf_3_4::DeepTiledInputFile::readPixelSampleCounts
              ((int)local_2b0,local_2bc,local_2c0,local_2c4,local_2c8,local_2cc);
    Imf_3_4::DeepTiledInputFile::dataWindowForTile
              ((int)local_390,(int)local_2b0,local_2bc,local_2c4);
    Imf_3_4::DeepTiledInputFile::dataWindowForTile
              ((int)local_3a0,(int)local_2b0,local_2c0,local_2c8);
    bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffffb5c,
                                      CONCAT13(in_stack_fffffffffffffb5b,
                                               CONCAT12(in_stack_fffffffffffffb5a,
                                                        CONCAT11(in_stack_fffffffffffffb59,
                                                                 in_stack_fffffffffffffb58)))),
                             in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                             in_stack_fffffffffffffb4c,y2,in_stack_fffffffffffffb44);
    uVar13 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb60);
    if (!bVar1) {
      __assert_fail("checkSampleCount ( sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x506,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(type,(Array2D<unsigned_int> *)CONCAT44(uVar5,uVar6),
                   (Array2D<unsigned_int_*> *)CONCAT44(type_00,iVar7),
                   (Array2D<float_*> *)CONCAT44(iVar8,iVar9),
                   (Array2D<Imath_3_2::half_*> *)CONCAT44(PVar14,uVar13),in_stack_fffffffffffffb5c,
                   iVar3,iVar15,in_stack_fffffffffffffba0);
    Imf_3_4::DeepTiledInputFile::readTiles
              ((int)local_2b0,local_2bc,local_2c0,local_2c4,local_2c8,local_2cc);
    iVar2 = local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
      in_stack_fffffffffffffb5b =
           checkPixels<unsigned_int>
                     ((Array2D<unsigned_int> *)CONCAT44(iVar8,iVar9),
                      (Array2D<unsigned_int_*> *)CONCAT44(PVar14,uVar13),0,
                      CONCAT13(in_stack_fffffffffffffb5b,
                               CONCAT12(in_stack_fffffffffffffb5a,
                                        CONCAT11(in_stack_fffffffffffffb59,in_stack_fffffffffffffb58
                                                ))),in_stack_fffffffffffffb54,
                      in_stack_fffffffffffffb50,width);
      if (!(bool)in_stack_fffffffffffffb5b) {
        __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x51f,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 1) {
      in_stack_fffffffffffffb5a =
           checkPixels<float>((Array2D<unsigned_int> *)CONCAT44(iVar8,iVar9),
                              (Array2D<float_*> *)CONCAT44(PVar14,uVar13),1,
                              CONCAT13(in_stack_fffffffffffffb5b,
                                       CONCAT12(in_stack_fffffffffffffb5a,
                                                CONCAT11(in_stack_fffffffffffffb59,
                                                         in_stack_fffffffffffffb58))),
                              in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,width);
      if (!(bool)in_stack_fffffffffffffb5a) {
        __assert_fail("checkPixels<float> ( sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x529,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_f0._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) &&
            (in_stack_fffffffffffffb59 =
                  checkPixels<Imath_3_2::half>
                            ((Array2D<unsigned_int> *)CONCAT44(iVar8,iVar9),
                             (Array2D<Imath_3_2::half_*> *)CONCAT44(PVar14,uVar13),2,
                             CONCAT13(in_stack_fffffffffffffb5b,
                                      CONCAT12(in_stack_fffffffffffffb5a,
                                               CONCAT11(in_stack_fffffffffffffb59,
                                                        in_stack_fffffffffffffb58))),
                             in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,width),
            !(bool)in_stack_fffffffffffffb59)) {
      __assert_fail("checkPixels<half> ( sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x533,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    releasePixels(type_00,(Array2D<unsigned_int_*> *)CONCAT44(iVar8,iVar9),
                  (Array2D<float_*> *)CONCAT44(PVar14,uVar13),
                  (Array2D<Imath_3_2::half_*> *)
                  CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffb5b,
                                          CONCAT12(in_stack_fffffffffffffb5a,
                                                   CONCAT11(in_stack_fffffffffffffb59,
                                                            in_stack_fffffffffffffb58)))),
                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,width,iVar4);
    Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1bf962);
    Imf_3_4::DeepTiledInputFile::~DeepTiledInputFile
              ((DeepTiledInputFile *)CONCAT44(in_stack_fffffffffffffb44,local_394));
    in_stack_fffffffffffffb40 = local_394;
  }
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
  ;
  Imf_3_4::Array2D<Imath_3_2::half_*>::~Array2D
            ((Array2D<Imath_3_2::half_*> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Imf_3_4::Array2D<float_*>::~Array2D
            ((Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Imf_3_4::Array2D<unsigned_int_*>::~Array2D
            ((Array2D<unsigned_int_*> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Imf_3_4::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
  ;
  return;
}

Assistant:

void
readFirstPart (const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    cout << "Reading first part " << flush;
    int pixelType = pixelTypes[0];
    //int levelMode = levelModes[0];

    int l1, l2;
    l1 = random_int (height);
    l2 = random_int (height);
    if (l1 > l2) swap (l1, l2);

    InputFile part (fn.c_str ());

    FrameBuffer frameBuffer;
    setInputFrameBuffer (
        frameBuffer, pixelType, uData, fData, hData, width, height);

    part.setFrameBuffer (frameBuffer);
    part.readPixels (l1, l2);

    switch (pixelType)
    {
        case 0:
            assert (
                checkPixels<unsigned int> (uData, 0, width - 1, l1, l2, width));
            break;
        case 1:
            assert (checkPixels<float> (fData, 0, width - 1, l1, l2, width));
            break;
        case 2:
            assert (checkPixels<half> (hData, 0, width - 1, l1, l2, width));
            break;
    }
}